

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O3

mecab_learner_node_t * __thiscall
MeCab::Tokenizer<mecab_learner_node_t,_mecab_learner_path_t>::getEOSNode
          (Tokenizer<mecab_learner_node_t,_mecab_learner_path_t> *this,
          Allocator<mecab_learner_node_t,_mecab_learner_path_t> *allocator)

{
  long lVar1;
  mecab_learner_node_t *__s;
  
  __s = FreeList<mecab_learner_node_t>::alloc
                  (*(FreeList<mecab_learner_node_t> **)(allocator + 0x18));
  memset(__s,0,0x98);
  lVar1 = *(long *)(allocator + 8);
  *(long *)(allocator + 8) = lVar1 + 1;
  __s->id = (uint)lVar1;
  __s->surface = "BOS/EOS";
  __s->feature = (this->bos_feature_).super_scoped_array<char>.ptr_;
  __s->stat = '\x03';
  __s->isbest = '\x01';
  return __s;
}

Assistant:

N *Tokenizer<N, P>::getEOSNode(Allocator<N, P> *allocator) const {
  N *eos_node = getBOSNode(allocator);  // same
  eos_node->stat = MECAB_EOS_NODE;
  return eos_node;
}